

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O3

PeerRef __thiscall
anon_unknown.dwarf_27b883::PeerManagerImpl::GetPeerRef(PeerManagerImpl *this,NodeId id)

{
  _func_int **pp_Var1;
  long lVar2;
  long lVar3;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_FS_OFFSET;
  PeerRef PVar4;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock31;
  unique_lock<std::mutex> local_30;
  element_type *local_20;
  
  local_20 = *(element_type **)(in_FS_OFFSET + 0x28);
  local_30._M_device = (mutex_type *)(id + 0x218);
  local_30._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_30);
  lVar3 = *(long *)(id + 0x250);
  if (lVar3 != 0) {
    lVar2 = id + 0x248;
    do {
      if (in_RDX <= *(long *)(lVar3 + 0x20)) {
        lVar2 = lVar3;
      }
      lVar3 = *(long *)(lVar3 + 0x10 + (ulong)(*(long *)(lVar3 + 0x20) < in_RDX) * 8);
    } while (lVar3 != 0);
    if ((lVar2 != id + 0x248) && (*(long *)(lVar2 + 0x20) <= in_RDX)) {
      pp_Var1 = *(_func_int ***)(lVar2 + 0x30);
      (this->super_PeerManager).super_CValidationInterface._vptr_CValidationInterface =
           *(_func_int ***)(lVar2 + 0x28);
      (this->super_PeerManager).super_NetEventsInterface._vptr_NetEventsInterface = pp_Var1;
      if (pp_Var1 != (_func_int **)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
          UNLOCK();
        }
        else {
          *(int *)(pp_Var1 + 1) = *(int *)(pp_Var1 + 1) + 1;
        }
      }
      goto LAB_001d7eea;
    }
  }
  (this->super_PeerManager).super_CValidationInterface._vptr_CValidationInterface =
       (_func_int **)0x0;
  (this->super_PeerManager).super_NetEventsInterface._vptr_NetEventsInterface = (_func_int **)0x0;
LAB_001d7eea:
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  if (*(element_type **)(in_FS_OFFSET + 0x28) == local_20) {
    PVar4.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar4.super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(in_FS_OFFSET + 0x28);
    return (PeerRef)PVar4.
                    super___shared_ptr<(anonymous_namespace)::Peer,_(__gnu_cxx::_Lock_policy)2>;
  }
  __stack_chk_fail();
}

Assistant:

PeerRef PeerManagerImpl::GetPeerRef(NodeId id) const
{
    LOCK(m_peer_mutex);
    auto it = m_peer_map.find(id);
    return it != m_peer_map.end() ? it->second : nullptr;
}